

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRay> * __thiscall
pbrt::RealisticCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,RealisticCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  float fVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  float n2;
  Float FVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Point3f PVar17;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  anon_struct_8_0_00000001_for___align local_b8;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  Float FStack_a0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_98;
  undefined1 local_88 [16];
  Ray local_70;
  anon_struct_8_0_00000001_for___align local_48;
  float fStack_40;
  float fStack_3c;
  float fStack_38;
  undefined8 uStack_34;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_28;
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)((this->super_CameraBase).film.
                            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                           0xffffffffffff);
  auVar11._8_8_ = 0;
  auVar11._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar11._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
  auVar4 = vcvtdq2ps_avx(auVar7);
  auVar4 = vdivps_avx(auVar11,auVar4);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (this->physicalExtent).pMin.super_Tuple2<pbrt::Point2,_float>;
  TVar2 = (this->physicalExtent).pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar7 = vsubps_avx(auVar16,auVar4);
  auVar8._0_4_ = auVar4._0_4_ * TVar2.x;
  auVar8._4_4_ = auVar4._4_4_ * TVar2.y;
  auVar8._8_4_ = auVar4._8_4_ * 0.0;
  auVar8._12_4_ = auVar4._12_4_ * 0.0;
  local_88 = vfmadd231ps_fma(auVar8,auVar12,auVar7);
  auVar10 = ZEXT856(local_88._8_8_);
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  local_d8 = vxorps_avx512vl(local_88,auVar4);
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = local_d8._0_4_;
  local_c8 = vmovshdup_avx(local_88);
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = local_c8._0_4_;
  PVar17 = SampleExitPupil(this,(Point2f *)&local_70,&sample.pLens,&local_dc);
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.z = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  auVar14._0_4_ = PVar17.super_Tuple3<pbrt::Point3,_float>.x + local_88._0_4_;
  auVar14._4_4_ = PVar17.super_Tuple3<pbrt::Point3,_float>.y + local_88._4_4_;
  auVar14._8_4_ = auVar10._0_4_ + local_88._8_4_;
  auVar14._12_4_ = auVar10._4_4_ + local_88._12_4_;
  auVar4 = vsubps_avx(auVar9._0_16_,local_88);
  auVar4 = vblendps_avx(auVar14,auVar4,2);
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_d8._0_4_;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_c8._0_4_;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar4);
  local_d8._0_4_ = local_70.d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_70.time = 0.0;
  local_70.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_98.bits = 0;
  local_b8._0_4_ = 0.0;
  local_b8._4_4_ = 0.0;
  fStack_b0 = 0.0;
  fStack_ac = 0.0;
  fStack_a8 = 0.0;
  FStack_a0 = 0.0;
  fStack_a4 = fStack_b0;
  FVar5 = TraceLensesFromFilm(this,&local_70,(Ray *)&local_b8);
  if ((FVar5 != 0.0) || (NAN(FVar5))) {
    local_c8._0_4_ = FVar5;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(sample.time * (this->super_CameraBase).shutterClose)),
                             ZEXT416((uint)(1.0 - sample.time)),
                             ZEXT416((uint)(this->super_CameraBase).shutterOpen));
    FStack_a0 = auVar4._0_4_;
    local_98.bits =
         (this->super_CameraBase).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    AnimatedTransform::operator()
              ((Ray *)&local_48,(AnimatedTransform *)this,(Ray *)&local_b8,(Float *)0x0);
    fStack_a8 = fStack_38;
    fStack_a4 = (float)uStack_34;
    FStack_a0 = SUB84(uStack_34,4);
    local_b8 = local_48;
    fStack_b0 = fStack_40;
    fStack_ac = fStack_3c;
    local_98.bits = local_28.bits;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fStack_38 * fStack_38)),ZEXT416((uint)fStack_3c),
                             ZEXT416((uint)fStack_3c));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fStack_a4),ZEXT416((uint)fStack_a4));
    if (auVar4._0_4_ < 0.0) {
      fVar6 = sqrtf(auVar4._0_4_);
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
      fVar6 = auVar4._0_4_;
    }
    auVar13._4_4_ = fStack_a8;
    auVar13._0_4_ = fStack_ac;
    auVar13._8_8_ = 0;
    auVar15._4_4_ = fVar6;
    auVar15._0_4_ = fVar6;
    auVar15._8_4_ = fVar6;
    auVar15._12_4_ = fVar6;
    auVar4 = vdivps_avx(auVar13,auVar15);
    fStack_a4 = fStack_a4 / fVar6;
    uVar3 = vmovlps_avx(auVar4);
    fStack_ac = (float)uVar3;
    fStack_a8 = (float)((ulong)uVar3 >> 0x20);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_70.d.super_Tuple3<pbrt::Vector3,_float>.y *
                                           local_70.d.super_Tuple3<pbrt::Vector3,_float>.y)),
                             ZEXT416((uint)local_70.d.super_Tuple3<pbrt::Vector3,_float>.x),
                             ZEXT416((uint)local_70.d.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)local_d8._0_4_),ZEXT416((uint)local_d8._0_4_));
    if (auVar4._0_4_ < 0.0) {
      fVar6 = sqrtf(auVar4._0_4_);
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
      fVar6 = auVar4._0_4_;
    }
    fVar1 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
    fVar6 = ((float)local_d8._0_4_ / fVar6) * ((float)local_d8._0_4_ / fVar6);
    fVar6 = ((((this->super_CameraBase).shutterClose - (this->super_CameraBase).shutterOpen) *
              fVar6 * fVar6 * local_dc) / (fVar1 * fVar1)) * (float)local_c8._0_4_;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = local_b8;
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_ac,fStack_b0);
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_a8,fStack_ac);
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x14) = CONCAT44(FStack_a0,fStack_a4);
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_98.bits;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = fVar6;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = fVar6;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = fVar6;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x34) = fVar6;
  }
  else {
    *__return_storage_ptr__ = (optional<pbrt::CameraRay>)ZEXT1264(ZEXT812(0));
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> RealisticCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Find point on film, _pFilm_, corresponding to _sample.pFilm_
    Point2f s(sample.pFilm.x / film.FullResolution().x,
              sample.pFilm.y / film.FullResolution().y);
    Point2f pFilm2 = physicalExtent.Lerp(s);
    Point3f pFilm(-pFilm2.x, pFilm2.y, 0);

    // Trace ray from _pFilm_ through lens system
    Float exitPupilBoundsArea;
    Point3f pRear =
        SampleExitPupil(Point2f(pFilm.x, pFilm.y), sample.pLens, &exitPupilBoundsArea);
    Ray rFilm(pFilm, pRear - pFilm);
    Ray ray;
    Float weight = TraceLensesFromFilm(rFilm, &ray);
    if (weight == 0)
        return {};

    // Finish initialization of _RealisticCamera_ ray
    ray.time = SampleTime(sample.time);
    ray.medium = medium;
    ray = RenderFromCamera(ray);
    ray.d = Normalize(ray.d);

    // Compute weighting for _RealisticCamera_ ray
    Float cosTheta = Normalize(rFilm.d).z;
    weight *= (shutterClose - shutterOpen) * Pow<4>(cosTheta) * exitPupilBoundsArea /
              Sqr(LensRearZ());

    return CameraRay{ray, SampledSpectrum(weight)};
}